

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::MergeFrom
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  void *pvVar1;
  ArenaStringPtr AVar2;
  LogMessage *other;
  StringVector *this_00;
  Int64Vector *this_01;
  StringVector *from_00;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x456);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(from->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  AVar2.ptr_ = (from->iteminputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->iteminputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->numrecommendationsinputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->numrecommendationsinputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->itemrestrictioninputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->itemrestrictioninputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->itemexclusioninputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->itemexclusioninputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->recommendeditemlistoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->recommendeditemlistoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->recommendeditemscoreoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->recommendeditemscoreoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  if ((from != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) &&
     (from->itemstringids_ != (StringVector *)0x0)) {
    this_00 = mutable_itemstringids(this);
    from_00 = from->itemstringids_;
    if (from_00 == (StringVector *)0x0) {
      from_00 = (StringVector *)&_StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_00,from_00);
  }
  if ((from != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) &&
     (from->itemint64ids_ != (Int64Vector *)0x0)) {
    this_01 = mutable_itemint64ids(this);
    from_01 = from->itemint64ids_;
    if (from_01 == (Int64Vector *)0x0) {
      from_01 = (Int64Vector *)&_Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::MergeFrom(const ItemSimilarityRecommender& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ItemSimilarityRecommender)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  itemitemsimilarities_.MergeFrom(from.itemitemsimilarities_);
  if (from.iteminputfeaturename().size() > 0) {

    iteminputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iteminputfeaturename_);
  }
  if (from.numrecommendationsinputfeaturename().size() > 0) {

    numrecommendationsinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.numrecommendationsinputfeaturename_);
  }
  if (from.itemrestrictioninputfeaturename().size() > 0) {

    itemrestrictioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemrestrictioninputfeaturename_);
  }
  if (from.itemexclusioninputfeaturename().size() > 0) {

    itemexclusioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.itemexclusioninputfeaturename_);
  }
  if (from.recommendeditemlistoutputfeaturename().size() > 0) {

    recommendeditemlistoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemlistoutputfeaturename_);
  }
  if (from.recommendeditemscoreoutputfeaturename().size() > 0) {

    recommendeditemscoreoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.recommendeditemscoreoutputfeaturename_);
  }
  if (from.has_itemstringids()) {
    mutable_itemstringids()->::CoreML::Specification::StringVector::MergeFrom(from.itemstringids());
  }
  if (from.has_itemint64ids()) {
    mutable_itemint64ids()->::CoreML::Specification::Int64Vector::MergeFrom(from.itemint64ids());
  }
}